

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O3

void print_sym(WINDOW_conflict *win,curses_symdef_conflict *sym,attr_t extra_attrs,wchar_t bg_color)

{
  attr_t aVar1;
  cchar_t uni_out;
  undefined1 local_3c [28];
  
  if (ui_flags.color != '\0') {
    aVar1 = curses_color_attr(sym->color & 0x1f,bg_color);
    extra_attrs = extra_attrs | (sym->color & 0x20U) << 0xc | aVar1;
  }
  if ((sym->unichar[0] != L'\0') && (ui_flags.unicode != '\0')) {
    setcchar(local_3c,sym->unichar,extra_attrs,extra_attrs >> 8 & 0xff,0);
    wadd_wch(win,local_3c);
    return;
  }
  wattr_on(win,extra_attrs,0);
  waddch(win,(int)sym->ch);
  wattr_off(win,extra_attrs,0);
  return;
}

Assistant:

void print_sym(WINDOW *win, struct curses_symdef *sym,
	       attr_t extra_attrs, int bg_color)
{
    attr_t attr;
    cchar_t uni_out;

    /* in-game color index -> curses color */
    attr = A_NORMAL | extra_attrs;
    if (ui_flags.color) {
	attr |= curses_color_attr(sym->color & CLR_MASK, bg_color);
	if (sym->color & HI_ULINE) attr |= A_UNDERLINE;
    }

    /* print it; preferably as unicode */
    if (sym->unichar[0] && ui_flags.unicode) {
	int color = PAIR_NUMBER(attr);
	setcchar(&uni_out, sym->unichar, attr, color, NULL);
	wadd_wch(win, &uni_out);
    } else {
	wattron(win, attr);
	waddch(win, sym->ch);
	wattroff(win, attr);
    }
}